

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::anon_unknown_22::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  int iVar5;
  __node_ptr p_Var6;
  _Hash_node_base *p_Var7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  LogMessage *pLVar9;
  unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
  *puVar10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  __node_base _Var14;
  pointer __ptr_1;
  undefined1 auVar15 [16];
  LogFinisher local_9d;
  int local_9c;
  size_t local_98;
  __node_ptr local_90;
  string local_88;
  undefined1 local_68 [24];
  _Alloc_hider _Stack_50;
  _Hash_node_base *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  if (((anonymous_namespace)::
       Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
       ::local_static_registry == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                                   ::local_static_registry), iVar5 != 0)) {
    puVar10 = (unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
               *)operator_new(0x38);
    (puVar10->_M_h)._M_buckets = &(puVar10->_M_h)._M_single_bucket;
    (puVar10->_M_h)._M_bucket_count = 1;
    (puVar10->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (puVar10->_M_h)._M_element_count = 0;
    (puVar10->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (puVar10->_M_h)._M_rehash_policy._M_next_resize = 0;
    (puVar10->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    OnShutdownRun(OnShutdownDelete<std::unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>_>
                  ::anon_class_1_0_00000001::__invoke,puVar10);
    Register::local_static_registry = puVar10;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                         ::local_static_registry);
  }
  puVar10 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  local_68[0x10] = info.type;
  local_68[0x11] = info.is_repeated;
  local_68[0x12] = info.is_packed;
  local_68._19_5_ = info._3_5_;
  _Stack_50._M_p = (pointer)info.field_3.enum_validity_check.func;
  local_48 = (_Hash_node_base *)info.field_3.enum_validity_check.arg;
  aStack_40._M_allocated_capacity = (size_type)info.descriptor;
  p_Var13 = (_Hash_node_base *)((long)number ^ (ulong)containing_type);
  uVar11 = (ulong)p_Var13 % (Register::local_static_registry->_M_h)._M_bucket_count;
  local_68._0_8_ = containing_type;
  local_68._8_4_ = number;
  p_Var6 = std::
           _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&Register::local_static_registry->_M_h,uVar11,(key_type *)local_68,
                          (__hash_code)p_Var13);
  if (p_Var6 == (__node_ptr)0x0) {
    local_9c = number;
    local_90 = p_Var6;
    p_Var7 = (_Hash_node_base *)operator_new(0x40);
    p_Var7->_M_nxt = (_Hash_node_base *)0x0;
    p_Var7[1]._M_nxt = (_Hash_node_base *)local_68._0_8_;
    p_Var7[2]._M_nxt = (_Hash_node_base *)CONCAT44(local_68._12_4_,local_68._8_4_);
    p_Var7[3]._M_nxt = (_Hash_node_base *)local_68._16_8_;
    p_Var7[4]._M_nxt = (_Hash_node_base *)_Stack_50._M_p;
    p_Var7[5]._M_nxt = local_48;
    p_Var7[6]._M_nxt = (_Hash_node_base *)aStack_40._M_allocated_capacity;
    local_98 = (puVar10->_M_h)._M_rehash_policy._M_next_resize;
    auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(puVar10->_M_h)._M_rehash_policy,(puVar10->_M_h)._M_bucket_count,
                         (puVar10->_M_h)._M_element_count);
    __n = auVar15._8_8_;
    if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(puVar10->_M_h)._M_single_bucket;
        (puVar10->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_88,__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var14._M_nxt = (puVar10->_M_h)._M_before_begin._M_nxt;
      (puVar10->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(puVar10->_M_h)._M_before_begin;
        uVar11 = 0;
        do {
          p_Var3 = (_Var14._M_nxt)->_M_nxt;
          uVar12 = (ulong)_Var14._M_nxt[7]._M_nxt % __n;
          if (__s[uVar12] == (__node_base_ptr)0x0) {
            (_Var14._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var14._M_nxt;
            __s[uVar12] = p_Var1;
            if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var8 = __s + uVar11;
              goto LAB_001febec;
            }
          }
          else {
            (_Var14._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
            pp_Var8 = &__s[uVar12]->_M_nxt;
            uVar12 = uVar11;
LAB_001febec:
            *pp_Var8 = _Var14._M_nxt;
          }
          _Var14._M_nxt = p_Var3;
          uVar11 = uVar12;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (puVar10->_M_h)._M_buckets;
      if (&(puVar10->_M_h)._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4,(puVar10->_M_h)._M_bucket_count << 3);
      }
      (puVar10->_M_h)._M_bucket_count = __n;
      (puVar10->_M_h)._M_buckets = __s;
      uVar11 = (ulong)p_Var13 % __n;
    }
    p_Var7[7]._M_nxt = p_Var13;
    pp_Var4 = (puVar10->_M_h)._M_buckets;
    if (pp_Var4[uVar11] == (__node_base_ptr)0x0) {
      p_Var13 = (puVar10->_M_h)._M_before_begin._M_nxt;
      p_Var7->_M_nxt = p_Var13;
      (puVar10->_M_h)._M_before_begin._M_nxt = p_Var7;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var13[7]._M_nxt % (puVar10->_M_h)._M_bucket_count] = p_Var7;
      }
      (puVar10->_M_h)._M_buckets[uVar11] = &(puVar10->_M_h)._M_before_begin;
    }
    else {
      p_Var7->_M_nxt = pp_Var4[uVar11]->_M_nxt;
      pp_Var4[uVar11]->_M_nxt = p_Var7;
    }
    psVar2 = &(puVar10->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
    number = local_9c;
    if (local_90 == (__node_ptr)0x0) {
      return;
    }
  }
  LogMessage::LogMessage
            ((LogMessage *)local_68,LOGLEVEL_FATAL,
             "third_party/sentencepiece/third_party/protobuf-lite/extension_set.cc",0x6c);
  pLVar9 = LogMessage::operator<<
                     ((LogMessage *)local_68,"Multiple extension registrations for type \"");
  (*containing_type->_vptr_MessageLite[2])(&local_88,containing_type);
  pLVar9 = LogMessage::operator<<(pLVar9,&local_88);
  pLVar9 = LogMessage::operator<<(pLVar9,"\", field number ");
  pLVar9 = LogMessage::operator<<(pLVar9,number);
  pLVar9 = LogMessage::operator<<(pLVar9,".");
  LogFinisher::operator=(&local_9d,pLVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  LogMessage::~LogMessage((LogMessage *)local_68);
  return;
}

Assistant:

void Register(const MessageLite* containing_type, int number,
              ExtensionInfo info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry,
                               std::make_pair(containing_type, number), info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName() << "\", field number "
               << number << ".";
  }
}